

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::(anonymous_namespace)::
     sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
               (xpath_node *begin,xpath_node *end,document_order_comparator *pred)

{
  undefined1 auVar1 [16];
  xpath_node pivot;
  xpath_node **in_stack_ffffffffffffffa0;
  xpath_node *local_40;
  xpath_node *eqend;
  xpath_node *eqbeg;
  xpath_node *median;
  xpath_node *middle;
  document_order_comparator *pred_local;
  xpath_node *end_local;
  xpath_node *begin_local;
  
  middle = (xpath_node *)pred;
  pred_local = (document_order_comparator *)end;
  end_local = begin;
  while (0x10 < (long)pred_local - (long)end_local >> 4) {
    auVar1._8_8_ = (long)pred_local - (long)end_local >> 0x3f;
    auVar1._0_8_ = (long)pred_local - (long)end_local >> 4;
    median = end_local + SUB168(auVar1 / SEXT816(2),0);
    eqbeg = median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                      (end_local,median,(xpath_node *)(pred_local + -0x10),
                       (document_order_comparator *)middle);
    pivot._attribute._attr = (xml_attribute_struct *)middle;
    pivot._node._root = (xml_node_struct *)(eqbeg->_attribute)._attr;
    partition3<pugi::xpath_node,pugi::impl::(anonymous_namespace)::document_order_comparator>
              ((_anonymous_namespace_ *)end_local,(xpath_node *)pred_local,
               (xpath_node *)(eqbeg->_node)._root,pivot,(document_order_comparator *)&eqend,
               &local_40,in_stack_ffffffffffffffa0);
    if ((long)pred_local - (long)local_40 >> 4 < (long)eqend - (long)end_local >> 4) {
      sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                (local_40,(xpath_node *)pred_local,(document_order_comparator *)middle);
      pred_local = (document_order_comparator *)eqend;
    }
    else {
      sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                (end_local,eqend,(document_order_comparator *)middle);
      end_local = local_40;
    }
  }
  insertion_sort<pugi::xpath_node,pugi::impl::(anonymous_namespace)::document_order_comparator>
            (end_local,(xpath_node *)pred_local,(document_order_comparator *)middle);
  return;
}

Assistant:

PUGI_IMPL_FN void sort(I begin, I end, const Pred& pred)
	{
		// sort large chunks
		while (end - begin > 16)
		{
			// find median element
			I middle = begin + (end - begin) / 2;
			I median = median3(begin, middle, end - 1, pred);

			// partition in three chunks (< = >)
			I eqbeg, eqend;
			partition3(begin, end, *median, pred, &eqbeg, &eqend);

			// loop on larger half
			if (eqbeg - begin > end - eqend)
			{
				sort(eqend, end, pred);
				end = eqbeg;
			}
			else
			{
				sort(begin, eqbeg, pred);
				begin = eqend;
			}
		}

		// insertion sort small chunk
		insertion_sort(begin, end, pred);
	}